

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O3

uint32_t spvtools::opt::anon_unknown_0::NegateConstant(ConstantManager *const_mgr,Constant *c)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Instruction *pIVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar6;
  long lVar7;
  Constant *c_00;
  undefined4 extraout_var_05;
  undefined8 *puVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  uint32_t local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  iVar3 = (*c->type_->_vptr_Type[0xe])();
  if (CONCAT44(extraout_var,iVar3) == 0) {
    iVar3 = (*c->type_->_vptr_Type[0xc])();
    if (CONCAT44(extraout_var_02,iVar3) != 0) {
      uVar4 = NegateFloatingPointConstant(const_mgr,c);
      return uVar4;
    }
    iVar3 = (*c->type_->_vptr_Type[10])();
    if (CONCAT44(extraout_var_05,iVar3) != 0) {
      uVar4 = NegateIntegerConstant(const_mgr,c);
      return uVar4;
    }
    __assert_fail("c->type()->AsInteger()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x117,
                  "uint32_t spvtools::opt::(anonymous namespace)::NegateConstant(analysis::ConstantManager *, const analysis::Constant *)"
                 );
  }
  if (const_mgr == (ConstantManager *)0x0) {
    __assert_fail("const_mgr && c",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0xf7,
                  "uint32_t spvtools::opt::(anonymous namespace)::NegateVectorConstant(analysis::ConstantManager *, const analysis::Constant *)"
                 );
  }
  iVar3 = (*c->type_->_vptr_Type[0xe])();
  if (CONCAT44(extraout_var_00,iVar3) != 0) {
    iVar3 = (*c->_vptr_Constant[0x16])(c);
    if (CONCAT44(extraout_var_01,iVar3) == 0) {
      iVar3 = (*c->_vptr_Constant[0x13])(c);
      plVar1 = *(long **)(CONCAT44(extraout_var_03,iVar3) + 0x28);
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      iVar3 = (*c->_vptr_Constant[0x13])(c);
      plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0xc0))
                                 ((long *)CONCAT44(extraout_var_04,iVar3));
      puVar8 = (undefined8 *)*plVar6;
      puVar2 = (undefined8 *)plVar6[1];
      if (puVar8 != puVar2) {
        do {
          lVar7 = (**(code **)(*plVar1 + 0x60))(plVar1);
          if (lVar7 == 0) {
            lVar7 = (**(code **)(*plVar1 + 0x50))(plVar1);
            if (lVar7 == 0) {
              __assert_fail("component_type->AsInteger()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                            ,0x104,
                            "uint32_t spvtools::opt::(anonymous namespace)::NegateVectorConstant(analysis::ConstantManager *, const analysis::Constant *)"
                           );
            }
            local_4c = NegateIntegerConstant(const_mgr,(Constant *)*puVar8);
          }
          else {
            local_4c = NegateFloatingPointConstant(const_mgr,(Constant *)*puVar8);
          }
          if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_48,
                       (iterator)
                       local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_4c);
          }
          else {
            *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_4c;
            local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          puVar8 = puVar8 + 1;
        } while (puVar8 != puVar2);
      }
      c_00 = analysis::ConstantManager::GetConstant(const_mgr,c->type_,&local_48);
      uVar4 = 0;
      pIVar5 = analysis::ConstantManager::GetDefiningInstruction
                         (const_mgr,c_00,0,(inst_iterator *)0x0);
      if (pIVar5->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
      }
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      uVar4 = 0;
      pIVar5 = analysis::ConstantManager::GetDefiningInstruction(const_mgr,c,0,(inst_iterator *)0x0)
      ;
      if (pIVar5->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
        return uVar4;
      }
    }
    return uVar4;
  }
  __assert_fail("c->type()->AsVector()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0xf8,
                "uint32_t spvtools::opt::(anonymous namespace)::NegateVectorConstant(analysis::ConstantManager *, const analysis::Constant *)"
               );
}

Assistant:

uint32_t NegateConstant(analysis::ConstantManager* const_mgr,
                        const analysis::Constant* c) {
  if (c->type()->AsVector()) {
    return NegateVectorConstant(const_mgr, c);
  } else if (c->type()->AsFloat()) {
    return NegateFloatingPointConstant(const_mgr, c);
  } else {
    assert(c->type()->AsInteger());
    return NegateIntegerConstant(const_mgr, c);
  }
}